

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O0

char * test_matrix2_multiply(void)

{
  int iVar1;
  float afVar2 [2];
  undefined1 local_40 [8];
  matrix2 mR;
  matrix2 m2;
  matrix2 m1;
  
  m2.field_0.m[2] = 1.0;
  m2.field_0.m[3] = 2.0;
  local_40._0_4_ = 11.0;
  local_40._4_4_ = 14.0;
  mR.field_0.m[0] = 35.0;
  mR.field_0.m[1] = 46.0;
  matrix2_set((matrix2 *)((long)&mR.field_0 + 8),(matrix2 *)((long)&m2.field_0 + 8));
  matrix2_multiply((matrix2 *)((long)&mR.field_0 + 8),(matrix2 *)((long)&m2.field_0 + 8));
  iVar1 = matrix2_equals((matrix2 *)local_40,(matrix2 *)((long)&mR.field_0 + 8));
  if (iVar1 == 0) {
    m1.field_0.field_1.m22[1] = (float  [2])anon_var_dwarf_412;
  }
  else {
    m1.field_0._8_4_ = 0.0;
    m1.field_0._12_4_ = 0.0;
  }
  afVar2[0] = (float)m1.field_0._8_4_;
  afVar2[1] = (float)m1.field_0._12_4_;
  return (char *)afVar2;
}

Assistant:

static char *test_matrix2_multiply(void)
{
	struct matrix2 m1, m2, mR;

	m1.c00 = 1;  m1.c10 = 2;
	m1.c01 = 5;  m1.c11 = 6;

	mR.c00 = 11;  mR.c10 = 14;
	mR.c01 = 35;  mR.c11 = 46;

	/* copy m1 -> m2 */
	matrix2_set(&m2, &m1);

	matrix2_multiply(&m2, &m1);
	test_assert(matrix2_equals(&mR, &m2));

	return NULL;
}